

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O3

FT_Error cff_slot_load(CFF_GlyphSlot glyph,CFF_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  FT_Outline *outline;
  ushort uVar2;
  short sVar3;
  short sVar4;
  TT_Face face;
  void *pvVar5;
  void *pvVar6;
  undefined8 *puVar7;
  FT_Face pFVar8;
  long lVar9;
  long c_;
  FT_Incremental_InterfaceRec *pFVar10;
  FT_Incremental_GetGlyphMetricsFunc p_Var11;
  FT_Slot_Internal pFVar12;
  FT_Fixed FVar13;
  FT_ULong length;
  bool bVar14;
  byte bVar15;
  int iVar16;
  FT_Error FVar17;
  FT_Long FVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  FT_UInt glyph_index_00;
  int iVar23;
  undefined4 in_register_00000014;
  FT_Vector *pFVar24;
  uint uVar25;
  FT_Outline *cur;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  long local_b88;
  long local_b68;
  FT_ULong charstring_len;
  FT_Matrix font_matrix;
  FT_Byte *charstring;
  long lStack_b30;
  long local_b28;
  long lStack_b20;
  TT_SBit_MetricsRec metrics;
  FT_Byte *local_ad0;
  long local_ac0;
  long lStack_ab8;
  long local_a88;
  code *local_a70;
  ulong local_688;
  PS_Decoder psdecoder;
  
  uVar19 = CONCAT44(in_register_00000014,glyph_index);
  face = (TT_Face)(glyph->root).face;
  pvVar5 = face->psaux;
  pvVar6 = (face->extra).data;
  puVar7 = *(undefined8 **)((long)pvVar5 + 0x50);
  if ((*(int *)((long)pvVar6 + 0x74c) == 0xffff) || (*(long *)((long)pvVar6 + 0x528) == 0)) {
    if (*(uint *)((long)pvVar6 + 0x24) <= glyph_index) {
      return 6;
    }
  }
  else if (glyph_index == 0) {
    uVar19 = 0;
  }
  else {
    if (*(uint *)((long)pvVar6 + 0x530) < glyph_index) {
      return 6;
    }
    uVar2 = *(ushort *)(*(long *)((long)pvVar6 + 0x528) + (ulong)glyph_index * 2);
    uVar19 = (ulong)uVar2;
    if (uVar2 == 0) {
      return 6;
    }
  }
  uVar25 = load_flags | 3;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar25 = load_flags;
  }
  glyph->x_scale = 0x10000;
  glyph->y_scale = 0x10000;
  if (size != (CFF_Size)0x0) {
    FVar13 = (size->root).metrics.y_scale;
    glyph->x_scale = (size->root).metrics.x_scale;
    glyph->y_scale = FVar13;
    if (size->strike_index != 0xffffffff) {
      pFVar8 = (size->root).face;
      lVar22 = *(long *)&pFVar8[3].units_per_EM;
      if ((*(long *)(lVar22 + 0xc0) != 0) && ((uVar25 & 8) == 0)) {
        iVar16 = (**(code **)(lVar22 + 0x90))
                           (face,size->strike_index,uVar19,uVar25,pFVar8->stream,
                            &(glyph->root).bitmap,&metrics);
        if (iVar16 == 0) {
          (glyph->root).outline.n_contours = 0;
          (glyph->root).outline.n_points = 0;
          (glyph->root).metrics.width = (ulong)metrics.width << 6;
          (glyph->root).metrics.height = (ulong)metrics.height << 6;
          (glyph->root).metrics.horiBearingX = (long)metrics.horiBearingX << 6;
          (glyph->root).metrics.horiBearingY = (long)metrics.horiBearingY << 6;
          (glyph->root).metrics.horiAdvance = (ulong)metrics.horiAdvance << 6;
          (glyph->root).metrics.vertBearingX = (long)metrics.vertBearingX << 6;
          (glyph->root).metrics.vertBearingY = (long)metrics.vertBearingY << 6;
          (glyph->root).metrics.vertAdvance = (ulong)metrics.vertAdvance << 6;
          bVar26 = (uVar25 & 0x10) == 0;
          if (bVar26) {
            metrics.vertBearingX = metrics.horiBearingX;
          }
          if (bVar26) {
            metrics.vertBearingY = metrics.horiBearingY;
          }
          (glyph->root).format = FT_GLYPH_FORMAT_BITMAP;
          (glyph->root).bitmap_left = (int)metrics.vertBearingX;
          (glyph->root).bitmap_top = (int)metrics.vertBearingY;
          (**(code **)((long)face->sfnt + 0xe0))(face,0,uVar19 & 0xffffffff,&font_matrix,&psdecoder)
          ;
          (glyph->root).linearHoriAdvance = (ulong)(ushort)psdecoder.builder.memory;
          if ((face->vertical_info == '\0') || ((face->vertical).number_Of_VMetrics == 0)) {
            if ((face->os2).version == 0xffff) {
              sVar4 = (face->horizontal).Ascender;
              sVar3 = (face->horizontal).Descender;
            }
            else {
              sVar4 = (face->os2).sTypoAscender;
              sVar3 = (face->os2).sTypoDescender;
            }
            uVar19 = (long)sVar4 - (long)sVar3;
          }
          else {
            (**(code **)((long)face->sfnt + 0xe0))
                      (face,1,uVar19 & 0xffffffff,&font_matrix,&psdecoder);
            uVar19 = (ulong)(ushort)psdecoder.builder.memory;
          }
          (glyph->root).linearVertAdvance = uVar19;
          return 0;
        }
        uVar19 = uVar19 & 0xffffffff;
      }
    }
  }
  if ((uVar25 >> 0xe & 1) == 0) {
    glyph_index_00 = (FT_UInt)uVar19;
    if (*(int *)((long)pvVar6 + 0xb30) == 0) {
      font_matrix.xx = *(FT_Fixed *)((long)pvVar6 + 0x6a8);
      font_matrix.xy = *(FT_Fixed *)((long)pvVar6 + 0x6b0);
      font_matrix.yx = *(FT_Fixed *)((long)pvVar6 + 0x6b8);
      font_matrix.yy = *(FT_Fixed *)((long)pvVar6 + 0x6c0);
      local_b88 = *(long *)((long)pvVar6 + 0x6d8);
      local_b68 = *(long *)((long)pvVar6 + 0x6e0);
      bVar26 = false;
    }
    else {
      bVar15 = cff_fd_select_get((CFF_FDSelect)((long)pvVar6 + 0x1338),glyph_index_00);
      uVar21 = (ulong)(*(uint *)((long)pvVar6 + 0xb30) - 1) & 0xff;
      if ((uint)bVar15 < *(uint *)((long)pvVar6 + 0xb30)) {
        uVar21 = (ulong)bVar15;
      }
      lVar22 = *(long *)((long)pvVar6 + 0x6d0);
      lVar9 = *(long *)((long)pvVar6 + uVar21 * 8 + 0xb38);
      c_ = *(long *)(lVar9 + 0x68);
      font_matrix.xx = *(FT_Fixed *)(lVar9 + 0x40);
      font_matrix.xy = *(FT_Fixed *)(lVar9 + 0x48);
      font_matrix.yx = *(FT_Fixed *)(lVar9 + 0x50);
      font_matrix.yy = *(FT_Fixed *)(lVar9 + 0x58);
      local_b88 = *(long *)(lVar9 + 0x70);
      local_b68 = *(long *)(lVar9 + 0x78);
      bVar26 = lVar22 != c_;
      if (bVar26) {
        FVar18 = FT_MulDiv(glyph->x_scale,lVar22,c_);
        glyph->x_scale = FVar18;
        FVar18 = FT_MulDiv(glyph->y_scale,lVar22,c_);
        glyph->y_scale = FVar18;
      }
    }
    (glyph->root).outline.n_contours = 0;
    (glyph->root).outline.n_points = 0;
    bVar15 = (byte)uVar25 & 1;
    bVar27 = (uVar25 & 2) == 0;
    glyph->hint = bVar27;
    glyph->scaled = bVar15 ^ 1;
    (glyph->root).format = FT_GLYPH_FORMAT_OUTLINE;
    (*(code *)*puVar7)(&metrics,face,size,glyph,bVar27,uVar25 >> 0x10 & 0xf,cff_get_glyph_data,
                       cff_free_glyph_data);
    FVar17 = cff_get_glyph_data(face,glyph_index_00,&charstring,&charstring_len);
    if (FVar17 != 0) {
      return FVar17;
    }
    iVar16 = (*(code *)puVar7[1])(&metrics,size,uVar19 & 0xffffffff);
    if (iVar16 != 0) {
      return iVar16;
    }
    (**(code **)((long)pvVar5 + 0x30))(&psdecoder,&metrics,0);
    length = CONCAT62(charstring_len._2_6_,(ushort)charstring_len);
    iVar16 = (*(code *)puVar7[2])(&psdecoder,charstring,length);
    bVar28 = (char)iVar16 == -0x5c;
    if (bVar28) {
      glyph->hint = '\0';
      iVar16 = (*(code *)puVar7[2])(&psdecoder,charstring,length);
      bVar26 = true;
    }
    cff_free_glyph_data(face,&charstring,length);
    if (iVar16 == 0) {
      if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
        if (*(long *)((long)pvVar6 + 0x568) != 0) {
          (glyph->root).control_data =
               (void *)(*(long *)(*(long *)((long)pvVar6 + 0x568) + (uVar19 & 0xffffffff) * 8) +
                        *(long *)((long)pvVar6 + 0x570) + -1);
          (glyph->root).control_len = length;
        }
      }
      else {
        (glyph->root).control_data = (void *)0x0;
        (glyph->root).control_len = 0;
      }
      (*local_a70)();
      pFVar10 = ((face->root).internal)->incremental_interface;
      if ((pFVar10 != (FT_Incremental_InterfaceRec *)0x0) &&
         (p_Var11 = pFVar10->funcs->get_glyph_metrics,
         p_Var11 != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
        charstring = local_ad0;
        lStack_b30 = 0;
        local_b28 = local_ac0;
        lStack_b20 = lStack_ab8;
        FVar17 = (*p_Var11)(pFVar10->object,glyph_index_00,'\0',
                            (FT_Incremental_MetricsRec *)&charstring);
        local_ad0 = charstring;
        if (FVar17 != 0) {
          return FVar17;
        }
      }
      if ((uVar25 >> 10 & 1) == 0) {
        if ((face->horizontal).number_Of_HMetrics != 0) {
          charstring = (FT_Byte *)((ulong)charstring & 0xffffffffffff0000);
          charstring_len._0_2_ = 0;
          (**(code **)((long)face->sfnt + 0xe0))
                    (face,0,uVar19 & 0xffffffff,&charstring,&charstring_len);
          local_688 = (ulong)(ushort)charstring_len;
          (glyph->root).metrics.horiBearingX = (long)(short)charstring;
        }
        (glyph->root).metrics.horiAdvance = local_688;
        (glyph->root).linearHoriAdvance = local_688;
        ((glyph->root).internal)->glyph_transformed = '\0';
        if ((face->vertical_info == '\0') || ((face->vertical).number_Of_VMetrics == 0)) {
          if ((face->os2).version == 0xffff) {
            sVar4 = (face->horizontal).Ascender;
            sVar3 = (face->horizontal).Descender;
          }
          else {
            sVar4 = (face->os2).sTypoAscender;
            sVar3 = (face->os2).sTypoDescender;
          }
          uVar19 = (long)sVar4 - (long)sVar3;
          (glyph->root).metrics.vertAdvance = uVar19;
          bVar14 = true;
        }
        else {
          bVar14 = false;
          charstring = (FT_Byte *)((ulong)charstring & 0xffffffffffff0000);
          charstring_len._0_2_ = 0;
          (**(code **)((long)face->sfnt + 0xe0))
                    (face,1,uVar19 & 0xffffffff,&charstring,&charstring_len);
          (glyph->root).metrics.vertBearingY = (long)(short)charstring;
          uVar19 = (ulong)(ushort)charstring_len;
          (glyph->root).metrics.vertAdvance = uVar19;
        }
        (glyph->root).linearVertAdvance = uVar19;
        (glyph->root).format = FT_GLYPH_FORMAT_OUTLINE;
        if (size == (CFF_Size)0x0) {
          uVar20 = 4;
        }
        else {
          uVar20 = (uint)((size->root).metrics.y_ppem < 0x18) << 8 | 4;
        }
        outline = &(glyph->root).outline;
        (glyph->root).outline.flags = uVar20;
        if ((((font_matrix.xx != 0x10000) || (font_matrix.yy != 0x10000)) || (font_matrix.xy != 0))
           || (font_matrix.yx != 0)) {
          FT_Outline_Transform(outline,&font_matrix);
          lVar22 = (long)(int)font_matrix.xx * (long)(int)(glyph->root).metrics.horiAdvance;
          (glyph->root).metrics.horiAdvance =
               (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
          lVar22 = (long)(int)font_matrix.yy * (long)(int)(glyph->root).metrics.vertAdvance;
          uVar19 = (ulong)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
          (glyph->root).metrics.vertAdvance = uVar19;
        }
        if (local_b88 != 0 || local_b68 != 0) {
          FT_Outline_Translate(outline,local_b88,local_b68);
          pFVar1 = &(glyph->root).metrics.horiAdvance;
          *pFVar1 = *pFVar1 + local_b88;
          uVar19 = local_b68 + (glyph->root).metrics.vertAdvance;
          (glyph->root).metrics.vertAdvance = uVar19;
        }
        if ((bVar15 & !bVar26) == 0) {
          iVar23 = (int)glyph->x_scale;
          iVar16 = (int)glyph->y_scale;
          if (((bVar28 || !bVar27) || local_a88 == 0) &&
             (sVar4 = (glyph->root).outline.n_points, 0 < sVar4)) {
            pFVar24 = (glyph->root).outline.points;
            uVar20 = (int)sVar4 + 1;
            do {
              lVar22 = (long)(int)pFVar24->x * (long)iVar23;
              pFVar24->x = (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
              lVar22 = (long)(int)pFVar24->y * (long)iVar16;
              pFVar24->y = (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
              pFVar24 = pFVar24 + 1;
              uVar20 = uVar20 - 1;
            } while (1 < uVar20);
          }
          lVar22 = (long)iVar23 * (long)(int)(glyph->root).metrics.horiAdvance;
          (glyph->root).metrics.horiAdvance =
               (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
          lVar22 = (long)iVar16 * (long)(int)uVar19;
          (glyph->root).metrics.vertAdvance =
               (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
        }
        FT_Outline_Get_CBox(outline,(FT_BBox *)&charstring);
        (glyph->root).metrics.width = local_b28 - (long)charstring;
        (glyph->root).metrics.height = lStack_b20 - lStack_b30;
        (glyph->root).metrics.horiBearingX = (FT_Pos)charstring;
        (glyph->root).metrics.horiBearingY = lStack_b20;
        if (bVar14) {
          if ((uVar25 & 0x10) != 0) {
            ft_synthesize_vertical_metrics(&(glyph->root).metrics,(glyph->root).metrics.vertAdvance)
            ;
          }
        }
        else {
          (glyph->root).metrics.vertBearingX =
               (long)charstring - (glyph->root).metrics.horiAdvance / 2;
        }
      }
      else {
        pFVar12 = (glyph->root).internal;
        (glyph->root).metrics.horiBearingX = (FT_Pos)local_ad0;
        (glyph->root).metrics.horiAdvance = local_688;
        (pFVar12->glyph_matrix).yx = font_matrix.yx;
        (pFVar12->glyph_matrix).yy = font_matrix.yy;
        (pFVar12->glyph_matrix).xx = font_matrix.xx;
        (pFVar12->glyph_matrix).xy = font_matrix.xy;
        (pFVar12->glyph_delta).x = local_b88;
        (pFVar12->glyph_delta).y = local_b68;
        pFVar12->glyph_transformed = '\x01';
      }
      return 0;
    }
    return iVar16;
  }
  return 6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_slot_load( CFF_GlyphSlot  glyph,
                 CFF_Size       size,
                 FT_UInt        glyph_index,
                 FT_Int32       load_flags )
  {
    FT_Error     error;
    CFF_Decoder  decoder;
    PS_Decoder   psdecoder;
    TT_Face      face = (TT_Face)glyph->root.face;
    FT_Bool      hinting, scaled, force_scaling;
    CFF_Font     cff  = (CFF_Font)face->extra.data;

    PSAux_Service            psaux         = (PSAux_Service)face->psaux;
    const CFF_Decoder_Funcs  decoder_funcs = psaux->cff_decoder_funcs;

    FT_Matrix    font_matrix;
    FT_Vector    font_offset;


    force_scaling = FALSE;

    /* in a CID-keyed font, consider `glyph_index' as a CID and map */
    /* it immediately to the real glyph_index -- if it isn't a      */
    /* subsetted font, glyph_indices and CIDs are identical, though */
    if ( cff->top_font.font_dict.cid_registry != 0xFFFFU &&
         cff->charset.cids                               )
    {
      /* don't handle CID 0 (.notdef) which is directly mapped to GID 0 */
      if ( glyph_index != 0 )
      {
        glyph_index = cff_charset_cid_to_gindex( &cff->charset,
                                                 glyph_index );
        if ( glyph_index == 0 )
          return FT_THROW( Invalid_Argument );
      }
    }
    else if ( glyph_index >= cff->num_glyphs )
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    glyph->x_scale = 0x10000L;
    glyph->y_scale = 0x10000L;
    if ( size )
    {
      glyph->x_scale = size->root.metrics.x_scale;
      glyph->y_scale = size->root.metrics.y_scale;
    }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    /* try to load embedded bitmap if any              */
    /*                                                 */
    /* XXX: The convention should be emphasized in     */
    /*      the documents because it can be confusing. */
    if ( size )
    {
      CFF_Face      cff_face = (CFF_Face)size->root.face;
      SFNT_Service  sfnt     = (SFNT_Service)cff_face->sfnt;
      FT_Stream     stream   = cff_face->root.stream;


      if ( size->strike_index != 0xFFFFFFFFUL      &&
           sfnt->load_eblc                         &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        TT_SBit_MetricsRec  metrics;


        error = sfnt->load_sbit_image( face,
                                       size->strike_index,
                                       glyph_index,
                                       (FT_UInt)load_flags,
                                       stream,
                                       &glyph->root.bitmap,
                                       &metrics );

        if ( !error )
        {
          FT_Bool    has_vertical_info;
          FT_UShort  advance;
          FT_Short   dummy;


          glyph->root.outline.n_points   = 0;
          glyph->root.outline.n_contours = 0;

          glyph->root.metrics.width  = (FT_Pos)metrics.width  << 6;
          glyph->root.metrics.height = (FT_Pos)metrics.height << 6;

          glyph->root.metrics.horiBearingX = (FT_Pos)metrics.horiBearingX << 6;
          glyph->root.metrics.horiBearingY = (FT_Pos)metrics.horiBearingY << 6;
          glyph->root.metrics.horiAdvance  = (FT_Pos)metrics.horiAdvance  << 6;

          glyph->root.metrics.vertBearingX = (FT_Pos)metrics.vertBearingX << 6;
          glyph->root.metrics.vertBearingY = (FT_Pos)metrics.vertBearingY << 6;
          glyph->root.metrics.vertAdvance  = (FT_Pos)metrics.vertAdvance  << 6;

          glyph->root.format = FT_GLYPH_FORMAT_BITMAP;

          if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
          {
            glyph->root.bitmap_left = metrics.vertBearingX;
            glyph->root.bitmap_top  = metrics.vertBearingY;
          }
          else
          {
            glyph->root.bitmap_left = metrics.horiBearingX;
            glyph->root.bitmap_top  = metrics.horiBearingY;
          }

          /* compute linear advance widths */

          (void)( (SFNT_Service)face->sfnt )->get_metrics( face, 0,
                                                           glyph_index,
                                                           &dummy,
                                                           &advance );
          glyph->root.linearHoriAdvance = advance;

          has_vertical_info = FT_BOOL(
                                face->vertical_info                   &&
                                face->vertical.number_Of_VMetrics > 0 );

          /* get the vertical metrics from the vmtx table if we have one */
          if ( has_vertical_info )
          {
            (void)( (SFNT_Service)face->sfnt )->get_metrics( face, 1,
                                                             glyph_index,
                                                             &dummy,
                                                             &advance );
            glyph->root.linearVertAdvance = advance;
          }
          else
          {
            /* make up vertical ones */
            if ( face->os2.version != 0xFFFFU )
              glyph->root.linearVertAdvance = (FT_Pos)
                ( face->os2.sTypoAscender - face->os2.sTypoDescender );
            else
              glyph->root.linearVertAdvance = (FT_Pos)
                ( face->horizontal.Ascender - face->horizontal.Descender );
          }

          return error;
        }
      }
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    /* return immediately if we only want the embedded bitmaps */
    if ( load_flags & FT_LOAD_SBITS_ONLY )
      return FT_THROW( Invalid_Argument );

    /* if we have a CID subfont, use its matrix (which has already */
    /* been multiplied with the root matrix)                       */

    /* this scaling is only relevant if the PS hinter isn't active */
    if ( cff->num_subfonts )
    {
      FT_Long  top_upm, sub_upm;
      FT_Byte  fd_index = cff_fd_select_get( &cff->fd_select,
                                             glyph_index );


      if ( fd_index >= cff->num_subfonts )
        fd_index = (FT_Byte)( cff->num_subfonts - 1 );

      top_upm = (FT_Long)cff->top_font.font_dict.units_per_em;
      sub_upm = (FT_Long)cff->subfonts[fd_index]->font_dict.units_per_em;


      font_matrix = cff->subfonts[fd_index]->font_dict.font_matrix;
      font_offset = cff->subfonts[fd_index]->font_dict.font_offset;

      if ( top_upm != sub_upm )
      {
        glyph->x_scale = FT_MulDiv( glyph->x_scale, top_upm, sub_upm );
        glyph->y_scale = FT_MulDiv( glyph->y_scale, top_upm, sub_upm );

        force_scaling = TRUE;
      }
    }
    else
    {
      font_matrix = cff->top_font.font_dict.font_matrix;
      font_offset = cff->top_font.font_dict.font_offset;
    }

    glyph->root.outline.n_points   = 0;
    glyph->root.outline.n_contours = 0;

    /* top-level code ensures that FT_LOAD_NO_HINTING is set */
    /* if FT_LOAD_NO_SCALE is active                         */
    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint        = hinting;
    glyph->scaled      = scaled;
    glyph->root.format = FT_GLYPH_FORMAT_OUTLINE;  /* by default */

    {
#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );
#endif


      FT_Byte*  charstring;
      FT_ULong  charstring_len;


      decoder_funcs->init( &decoder, face, size, glyph, hinting,
                           FT_LOAD_TARGET_MODE( load_flags ),
                           cff_get_glyph_data,
                           cff_free_glyph_data );

      /* this is for pure CFFs */
      if ( load_flags & FT_LOAD_ADVANCE_ONLY )
        decoder.width_only = TRUE;

      decoder.builder.no_recurse =
        (FT_Bool)( load_flags & FT_LOAD_NO_RECURSE );

      /* now load the unscaled outline */
      error = cff_get_glyph_data( face, glyph_index,
                                  &charstring, &charstring_len );
      if ( error )
        goto Glyph_Build_Finished;

      error = decoder_funcs->prepare( &decoder, size, glyph_index );
      if ( error )
        goto Glyph_Build_Finished;

#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      /* choose which CFF renderer to use */
      if ( driver->hinting_engine == FT_HINTING_FREETYPE )
        error = decoder_funcs->parse_charstrings_old( &decoder,
                                                      charstring,
                                                      charstring_len,
                                                      0 );
      else
#endif
      {
        psaux->ps_decoder_init( &psdecoder, &decoder, FALSE );

        error = decoder_funcs->parse_charstrings( &psdecoder,
                                                  charstring,
                                                  charstring_len );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          hinting       = FALSE;
          force_scaling = TRUE;
          glyph->hint   = hinting;

          error = decoder_funcs->parse_charstrings( &psdecoder,
                                                    charstring,
                                                    charstring_len );
        }
      }

      cff_free_glyph_data( face, &charstring, charstring_len );

      if ( error )
        goto Glyph_Build_Finished;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
      /* Control data and length may not be available for incremental */
      /* fonts.                                                       */
      if ( face->root.internal->incremental_interface )
      {
        glyph->root.control_data = NULL;
        glyph->root.control_len = 0;
      }
      else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

      /* We set control_data and control_len if charstrings is loaded. */
      /* See how charstring loads at cff_index_access_element() in     */
      /* cffload.c.                                                    */
      {
        CFF_Index  csindex = &cff->charstrings_index;


        if ( csindex->offsets )
        {
          glyph->root.control_data = csindex->bytes +
                                     csindex->offsets[glyph_index] - 1;
          glyph->root.control_len  = (FT_Long)charstring_len;
        }
      }

  Glyph_Build_Finished:
      /* save new glyph tables, if no error */
      if ( !error )
        decoder.builder.funcs.done( &decoder.builder );
      /* XXX: anything to do for broken glyph entry? */
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error                                                               &&
         face->root.internal->incremental_interface                           &&
         face->root.internal->incremental_interface->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = decoder.builder.left_bearing.x;
      metrics.bearing_y = 0;
      metrics.advance   = decoder.builder.advance.x;
      metrics.advance_v = decoder.builder.advance.y;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, FALSE, &metrics );

      decoder.builder.left_bearing.x = metrics.bearing_x;
      decoder.builder.advance.x      = metrics.advance;
      decoder.builder.advance.y      = metrics.advance_v;
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    if ( !error )
    {
      /* Now, set the metrics -- this is rather simple, as   */
      /* the left side bearing is the xMin, and the top side */
      /* bearing the yMax.                                   */

      /* For composite glyphs, return only left side bearing and */
      /* advance width.                                          */
      if ( load_flags & FT_LOAD_NO_RECURSE )
      {
        FT_Slot_Internal  internal = glyph->root.internal;


        glyph->root.metrics.horiBearingX = decoder.builder.left_bearing.x;
        glyph->root.metrics.horiAdvance  = decoder.glyph_width;
        internal->glyph_matrix           = font_matrix;
        internal->glyph_delta            = font_offset;
        internal->glyph_transformed      = 1;
      }
      else
      {
        FT_BBox            cbox;
        FT_Glyph_Metrics*  metrics = &glyph->root.metrics;
        FT_Bool            has_vertical_info;


        if ( face->horizontal.number_Of_HMetrics )
        {
          FT_Short   horiBearingX = 0;
          FT_UShort  horiAdvance  = 0;


          ( (SFNT_Service)face->sfnt )->get_metrics( face, 0,
                                                     glyph_index,
                                                     &horiBearingX,
                                                     &horiAdvance );
          metrics->horiAdvance          = horiAdvance;
          metrics->horiBearingX         = horiBearingX;
          glyph->root.linearHoriAdvance = horiAdvance;
        }
        else
        {
          /* copy the _unscaled_ advance width */
          metrics->horiAdvance          = decoder.glyph_width;
          glyph->root.linearHoriAdvance = decoder.glyph_width;
        }

        glyph->root.internal->glyph_transformed = 0;

        has_vertical_info = FT_BOOL( face->vertical_info                   &&
                                     face->vertical.number_Of_VMetrics > 0 );

        /* get the vertical metrics from the vmtx table if we have one */
        if ( has_vertical_info )
        {
          FT_Short   vertBearingY = 0;
          FT_UShort  vertAdvance  = 0;


          ( (SFNT_Service)face->sfnt )->get_metrics( face, 1,
                                                     glyph_index,
                                                     &vertBearingY,
                                                     &vertAdvance );
          metrics->vertBearingY = vertBearingY;
          metrics->vertAdvance  = vertAdvance;
        }
        else
        {
          /* make up vertical ones */
          if ( face->os2.version != 0xFFFFU )
            metrics->vertAdvance = (FT_Pos)( face->os2.sTypoAscender -
                                             face->os2.sTypoDescender );
          else
            metrics->vertAdvance = (FT_Pos)( face->horizontal.Ascender -
                                             face->horizontal.Descender );
        }

        glyph->root.linearVertAdvance = metrics->vertAdvance;

        glyph->root.format = FT_GLYPH_FORMAT_OUTLINE;

        glyph->root.outline.flags = 0;
        if ( size && size->root.metrics.y_ppem < 24 )
          glyph->root.outline.flags |= FT_OUTLINE_HIGH_PRECISION;

        glyph->root.outline.flags |= FT_OUTLINE_REVERSE_FILL;

        /* apply the font matrix, if any */
        if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
             font_matrix.xy != 0        || font_matrix.yx != 0        )
        {
          FT_Outline_Transform( &glyph->root.outline, &font_matrix );

          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                            font_matrix.xx );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                            font_matrix.yy );
        }

        if ( font_offset.x || font_offset.y )
        {
          FT_Outline_Translate( &glyph->root.outline,
                                font_offset.x,
                                font_offset.y );

          metrics->horiAdvance += font_offset.x;
          metrics->vertAdvance += font_offset.y;
        }

        if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || force_scaling )
        {
          /* scale the outline and the metrics */
          FT_Int       n;
          FT_Outline*  cur     = &glyph->root.outline;
          FT_Vector*   vec     = cur->points;
          FT_Fixed     x_scale = glyph->x_scale;
          FT_Fixed     y_scale = glyph->y_scale;


          /* First of all, scale the points */
          if ( !hinting || !decoder.builder.hints_funcs )
            for ( n = cur->n_points; n > 0; n--, vec++ )
            {
              vec->x = FT_MulFix( vec->x, x_scale );
              vec->y = FT_MulFix( vec->y, y_scale );
            }

          /* Then scale the metrics */
          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
        }

        /* compute the other metrics */
        FT_Outline_Get_CBox( &glyph->root.outline, &cbox );

        metrics->width  = cbox.xMax - cbox.xMin;
        metrics->height = cbox.yMax - cbox.yMin;

        metrics->horiBearingX = cbox.xMin;
        metrics->horiBearingY = cbox.yMax;

        if ( has_vertical_info )
          metrics->vertBearingX = metrics->horiBearingX -
                                    metrics->horiAdvance / 2;
        else
        {
          if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
            ft_synthesize_vertical_metrics( metrics,
                                            metrics->vertAdvance );
        }
      }
    }

    return error;
  }